

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::WriteTargets(cmGlobalGhsMultiGenerator *this,cmLocalGenerator *root)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  int iVar3;
  string *psVar4;
  reference ppcVar5;
  undefined4 extraout_var;
  cmGeneratorTarget **tgt;
  iterator __end3;
  iterator __begin3;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range3;
  cmAlphaNum local_438;
  string local_408;
  undefined1 local_3e8 [8];
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> build;
  cmGeneratedFileStream fbld;
  cmAlphaNum local_138;
  undefined1 local_108 [8];
  string fname;
  cmAlphaNum local_b8;
  undefined1 local_88 [8];
  string name;
  cmGeneratorTarget *target;
  iterator __end1;
  iterator __begin1;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range1;
  string rootBinaryDir;
  cmLocalGenerator *root_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  rootBinaryDir.field_2._8_8_ = root;
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(root);
  std::__cxx11::string::string((string *)&__range1,(string *)psVar4);
  __end1 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::begin
                     (&this->ProjectTargets);
  target = (cmGeneratorTarget *)
           std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::end
                     (&this->ProjectTargets);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                *)&target);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&__range1);
      return;
    }
    ppcVar5 = __gnu_cxx::
              __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppcVar5;
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if (((TVar2 != INTERFACE_LIBRARY) &&
        (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 != MODULE_LIBRARY)) &&
       (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 != SHARED_LIBRARY)) {
      TVar2 = cmGeneratorTarget::GetType(this_00);
      if (TVar2 == GLOBAL_TARGET) {
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
        iVar3 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x1a])();
        bVar1 = std::operator!=(psVar4,(char *)CONCAT44(extraout_var,iVar3));
        if (bVar1) goto LAB_0062fdee;
      }
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
      cmAlphaNum::cmAlphaNum(&local_b8,psVar4);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&fname.field_2 + 8),".tgt");
      cmStrCat<char_const*>
                ((string *)local_88,&local_b8,(cmAlphaNum *)((long)&fname.field_2 + 8),
                 &FILE_EXTENSION);
      cmAlphaNum::cmAlphaNum(&local_138,(string *)&__range1);
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&fbld.field_0x260,"/");
      cmStrCat<std::__cxx11::string>
                ((string *)local_108,&local_138,(cmAlphaNum *)&fbld.field_0x260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)
                 &build.
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_108,false,None)
      ;
      cmGeneratedFileStream::SetCopyIfDifferent
                ((cmGeneratedFileStream *)
                 &build.
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
      WriteFileHeader(this,(ostream *)
                           &build.
                            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      GhsMultiGpj::WriteGpjTag
                (PROJECT,(ostream *)
                         &build.
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::vector
                ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
                 local_3e8);
      bVar1 = ComputeTargetBuildOrder
                        (this,this_00,
                         (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          *)local_3e8);
      if (bVar1) {
        cmAlphaNum::cmAlphaNum(&local_438,"The inter-target dependency graph for target [");
        psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range3,psVar4);
        cmStrCat<char[16]>(&local_408,&local_438,(cmAlphaNum *)&__range3,
                           (char (*) [16])"] had a cycle.\n");
        cmSystemTools::Error(&local_408);
        std::__cxx11::string::~string((string *)&local_408);
      }
      else {
        __end3 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                 ::begin((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          *)local_3e8);
        tgt = (cmGeneratorTarget **)
              std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              end((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
                  local_3e8);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                           *)&tgt), bVar1) {
          ppcVar5 = __gnu_cxx::
                    __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                    ::operator*(&__end3);
          WriteProjectLine(this,(ostream *)
                                &build.
                                 super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppcVar5,
                           (string *)&__range1);
          __gnu_cxx::
          __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
          ::operator++(&__end3);
        }
      }
      cmGeneratedFileStream::Close
                ((cmGeneratedFileStream *)
                 &build.
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::~vector
                ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
                 local_3e8);
      cmGeneratedFileStream::~cmGeneratedFileStream
                ((cmGeneratedFileStream *)
                 &build.
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)local_88);
    }
LAB_0062fdee:
    __gnu_cxx::
    __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteTargets(cmLocalGenerator* root)
{
  std::string rootBinaryDir = root->GetCurrentBinaryDirectory();

  // All known targets
  for (cmGeneratorTarget const* target : this->ProjectTargets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
         target->GetName() != this->GetInstallTargetName())) {
      continue;
    }

    // create target build file
    std::string name = cmStrCat(target->GetName(), ".tgt", FILE_EXTENSION);
    std::string fname = cmStrCat(rootBinaryDir, "/", name);
    cmGeneratedFileStream fbld(fname);
    fbld.SetCopyIfDifferent(true);
    this->WriteFileHeader(fbld);
    GhsMultiGpj::WriteGpjTag(GhsMultiGpj::PROJECT, fbld);
    std::vector<cmGeneratorTarget const*> build;
    if (this->ComputeTargetBuildOrder(target, build)) {
      cmSystemTools::Error(
        cmStrCat("The inter-target dependency graph for target [",
                 target->GetName(), "] had a cycle.\n"));
    } else {
      for (auto& tgt : build) {
        this->WriteProjectLine(fbld, tgt, rootBinaryDir);
      }
    }
    fbld.Close();
  }
}